

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

char * MIR_alias_name(MIR_context_t ctx,MIR_alias_t alias)

{
  size_t sVar1;
  string_t *psVar2;
  char *pcVar3;
  undefined8 *puVar4;
  
  if (alias == 0) {
    pcVar3 = "";
  }
  else {
    sVar1 = VARR_string_tlength(ctx->alias_ctx->aliases);
    if (sVar1 <= alias) {
      puVar4 = (undefined8 *)0x3;
      (*ctx->error_func)(MIR_alloc_error,"Wrong alias number");
      if (puVar4 != (undefined8 *)0x0) {
        return (char *)*puVar4;
      }
      mir_varr_assert_fail("length","string_t");
    }
    psVar2 = VARR_string_taddr(ctx->alias_ctx->aliases);
    pcVar3 = psVar2[alias].str.s;
  }
  return pcVar3;
}

Assistant:

const char *MIR_alias_name (MIR_context_t ctx, MIR_alias_t alias) {
  if (alias == 0) return "";
  if (alias >= VARR_LENGTH (string_t, aliases))
    MIR_get_error_func (ctx) (MIR_alloc_error, "Wrong alias number");
  return VARR_ADDR (string_t, aliases)[alias].str.s;
}